

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

int Inv(double *src,double (*dst) [4],double *determinant,double *pivot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double M [4] [4];
  double local_118 [19];
  double I [4] [4];
  
  pdVar10 = local_118 + 0x10;
  uVar19 = 0;
  *pivot = 0.0;
  *determinant = 0.0;
  local_118[0xe] = 0.0;
  local_118[0xb] = 0.0;
  local_118[4] = 0.0;
  local_118[1] = 0.0;
  local_118[0xc] = 0.0;
  local_118[0xd] = 0.0;
  local_118[8] = 0.0;
  local_118[9] = 0.0;
  local_118[6] = 0.0;
  local_118[7] = 0.0;
  local_118[2] = 0.0;
  local_118[3] = 0.0;
  local_118[0xf] = 1.0;
  local_118[10] = 1.0;
  local_118[5] = 1.0;
  local_118[0] = 1.0;
  pdVar11 = local_118 + 0x10;
  for (lVar13 = 0x10; dVar23 = local_118[0x10], lVar13 != 0; lVar13 = lVar13 + -1) {
    *pdVar11 = *src;
    src = src + 1;
    pdVar11 = pdVar11 + 1;
  }
  dVar21 = ABS(local_118[0x10]);
  uVar17 = 0;
  uVar14 = 0;
  do {
    uVar15 = 0;
    dVar24 = dVar21;
    do {
      dVar21 = ABS(*(double *)((long)pdVar10 + uVar15 * 8));
      if (dVar24 < dVar21) {
        uVar14 = uVar19 & 0xffffffff;
        uVar17 = uVar15 & 0xffffffff;
      }
      iVar12 = (int)uVar17;
      if (dVar21 <= dVar24) {
        dVar21 = dVar24;
      }
      uVar15 = uVar15 + 1;
      dVar24 = dVar21;
    } while (uVar15 != 4);
    uVar19 = uVar19 + 1;
    pdVar10 = (double *)((long)pdVar10 + 0x20);
  } while (uVar19 != 4);
  *pivot = dVar21;
  bVar20 = (int)uVar14 != 0;
  if (bVar20) {
    lVar13 = (long)(int)uVar14;
    local_118[0x10] = I[lVar13 + -1][1];
    I[lVar13 + -1][1] = dVar23;
    dVar23 = local_118[0x11];
    local_118[0x11] = I[lVar13 + -1][2];
    I[lVar13 + -1][2] = dVar23;
    dVar23 = local_118[0x12];
    local_118[0x12] = I[lVar13 + -1][3];
    I[lVar13 + -1][3] = dVar23;
    dVar23 = I[0][0];
    I[0][0] = I[lVar13][0];
    I[lVar13][0] = dVar23;
    local_118[0] = local_118[lVar13 * 4];
    local_118[lVar13 * 4] = 1.0;
    dVar23 = local_118[1];
    local_118[1] = I[lVar13 + -5][2];
    I[lVar13 + -5][2] = dVar23;
    dVar23 = local_118[2];
    local_118[2] = I[lVar13 + -5][3];
    I[lVar13 + -5][3] = dVar23;
    dVar23 = local_118[3];
    local_118[3] = I[lVar13 + -4][0];
    I[lVar13 + -4][0] = dVar23;
  }
  dVar23 = local_118[0x10];
  if (iVar12 == 0) {
    iVar12 = 0;
  }
  else {
    local_118[0x10] = local_118[(long)iVar12 + 0x10];
    local_118[(long)iVar12 + 0x10] = dVar23;
    dVar23 = I[0][1];
    I[0][1] = I[0][(long)iVar12 + 1];
    I[0][(long)iVar12 + 1] = dVar23;
    dVar23 = I[1][1];
    I[1][1] = I[1][(long)iVar12 + 1];
    I[1][(long)iVar12 + 1] = dVar23;
    dVar23 = I[2][1];
    I[2][1] = I[2][(long)iVar12 + 1];
    I[2][(long)iVar12 + 1] = dVar23;
    bVar20 = !bVar20;
  }
  dVar23 = I[0][1];
  iVar18 = 2;
  if (dVar21 <= 0.0) {
    iVar9 = 0;
    iVar16 = 1;
  }
  else {
    local_118[0x11] = local_118[0x11] / local_118[0x10];
    local_118[0x12] = local_118[0x12] / local_118[0x10];
    I[0][0] = I[0][0] / local_118[0x10];
    local_118[0] = local_118[0] / local_118[0x10];
    local_118[1] = local_118[1] / local_118[0x10];
    local_118[2] = local_118[2] / local_118[0x10];
    local_118[3] = local_118[3] / local_118[0x10];
    dVar24 = dVar21 * 2.220446049250313e-16;
    if (dVar24 < ABS(I[0][1])) {
      I[0][2] = I[0][2] - I[0][1] * local_118[0x11];
      I[0][3] = I[0][3] - I[0][1] * local_118[0x12];
      I[1][0] = I[1][0] - I[0][1] * I[0][0];
      local_118[4] = local_118[4] - I[0][1] * local_118[0];
      local_118[5] = local_118[5] - I[0][1] * local_118[1];
      local_118[6] = local_118[6] - I[0][1] * local_118[2];
      local_118[7] = local_118[7] - I[0][1] * local_118[3];
    }
    dVar1 = local_118[4];
    if (dVar24 < ABS(I[1][1])) {
      I[1][2] = I[1][2] - I[1][1] * local_118[0x11];
      I[1][3] = I[1][3] - I[1][1] * local_118[0x12];
      I[2][0] = I[2][0] - I[1][1] * I[0][0];
      local_118[8] = local_118[8] - I[1][1] * local_118[0];
      local_118[9] = local_118[9] - I[1][1] * local_118[1];
      local_118[10] = local_118[10] - I[1][1] * local_118[2];
      local_118[0xb] = local_118[0xb] - I[1][1] * local_118[3];
    }
    if (dVar24 < ABS(I[2][1])) {
      I[2][2] = I[2][2] - local_118[0x11] * I[2][1];
      I[2][3] = I[2][3] - local_118[0x12] * I[2][1];
      I[3][0] = I[3][0] - I[0][0] * I[2][1];
      local_118[0xc] = local_118[0xc] - local_118[0] * I[2][1];
      local_118[0xd] = local_118[0xd] - local_118[1] * I[2][1];
      local_118[0xe] = local_118[0xe] - local_118[2] * I[2][1];
      local_118[0xf] = local_118[0xf] - local_118[3] * I[2][1];
    }
    pdVar11 = I[0] + 2;
    dVar24 = ABS(I[0][2]);
    uVar17 = 1;
    uVar14 = 1;
    uVar19 = 1;
    do {
      uVar15 = 0;
      dVar2 = dVar24;
      do {
        dVar24 = ABS(pdVar11[uVar15]);
        uVar15 = uVar15 + 1;
        if (dVar2 < dVar24) {
          uVar19 = uVar14 & 0xffffffff;
          uVar17 = uVar15 & 0xffffffff;
        }
        iVar16 = (int)uVar17;
        if (dVar24 <= dVar2) {
          dVar24 = dVar2;
        }
        dVar2 = dVar24;
      } while (uVar15 != 3);
      uVar14 = uVar14 + 1;
      pdVar11 = pdVar11 + 4;
    } while (uVar14 != 4);
    if (dVar24 < dVar21) {
      *pivot = dVar24;
    }
    if ((int)uVar19 != 1) {
      lVar13 = (long)(int)uVar19;
      I[0][1] = I[lVar13 + -1][1];
      I[lVar13 + -1][1] = dVar23;
      dVar23 = I[0][2];
      I[0][2] = I[lVar13 + -1][2];
      I[lVar13 + -1][2] = dVar23;
      dVar23 = I[0][3];
      I[0][3] = I[lVar13 + -1][3];
      I[lVar13 + -1][3] = dVar23;
      dVar23 = I[1][0];
      I[1][0] = I[lVar13][0];
      I[lVar13][0] = dVar23;
      local_118[4] = local_118[lVar13 * 4];
      local_118[lVar13 * 4] = dVar1;
      dVar23 = local_118[5];
      local_118[5] = I[lVar13 + -5][2];
      I[lVar13 + -5][2] = dVar23;
      dVar23 = local_118[6];
      local_118[6] = I[lVar13 + -5][3];
      I[lVar13 + -5][3] = dVar23;
      dVar23 = local_118[7];
      local_118[7] = I[lVar13 + -4][0];
      I[lVar13 + -4][0] = dVar23;
      bVar20 = (bool)(bVar20 ^ 1);
    }
    dVar23 = local_118[0x11];
    iVar9 = 1;
    if (iVar16 == 1) {
      iVar16 = 1;
    }
    else {
      local_118[0x11] = local_118[(long)iVar16 + 0x10];
      local_118[(long)iVar16 + 0x10] = dVar23;
      dVar23 = I[0][2];
      I[0][2] = I[0][(long)iVar16 + 1];
      I[0][(long)iVar16 + 1] = dVar23;
      dVar23 = I[1][2];
      I[1][2] = I[1][(long)iVar16 + 1];
      I[1][(long)iVar16 + 1] = dVar23;
      dVar23 = I[2][2];
      I[2][2] = I[2][(long)iVar16 + 1];
      I[2][(long)iVar16 + 1] = dVar23;
      bVar20 = (bool)(bVar20 ^ 1);
    }
    dVar21 = I[1][2];
    dVar23 = I[1][1];
    if (0.0 < dVar24) {
      dVar1 = I[0][3] / I[0][2];
      I[0][3] = dVar1;
      I[1][0] = I[1][0] / I[0][2];
      local_118[4] = local_118[4] / I[0][2];
      local_118[5] = local_118[5] / I[0][2];
      local_118[6] = local_118[6] / I[0][2];
      local_118[7] = local_118[7] / I[0][2];
      dVar24 = dVar24 * 2.220446049250313e-16;
      if (dVar24 < ABS(local_118[0x11])) {
        local_118[0x12] = local_118[0x12] - local_118[0x11] * dVar1;
        I[0][0] = I[0][0] - local_118[0x11] * I[1][0];
        local_118[0] = local_118[0] - local_118[0x11] * local_118[4];
        local_118[1] = local_118[1] - local_118[5] * local_118[0x11];
        local_118[2] = local_118[2] - local_118[6] * local_118[0x11];
        local_118[3] = local_118[3] - local_118[0x11] * local_118[7];
      }
      dVar2 = local_118[0x12];
      if (dVar24 < ABS(I[1][2])) {
        I[1][3] = I[1][3] - I[1][2] * dVar1;
        I[2][0] = I[2][0] - I[1][2] * I[1][0];
        local_118[8] = local_118[8] - I[1][2] * local_118[4];
        local_118[9] = local_118[9] - local_118[5] * I[1][2];
        local_118[10] = local_118[10] - local_118[6] * I[1][2];
        local_118[0xb] = local_118[0xb] - I[1][2] * local_118[7];
      }
      dVar8 = I[2][0];
      dVar7 = I[1][3];
      dVar6 = local_118[0xb];
      dVar5 = local_118[10];
      dVar4 = local_118[9];
      dVar3 = local_118[8];
      if (dVar24 < ABS(I[2][2])) {
        I[2][3] = I[2][3] - dVar1 * I[2][2];
        I[3][0] = I[3][0] - I[1][0] * I[2][2];
        local_118[0xc] = local_118[0xc] - I[2][2] * local_118[4];
        local_118[0xd] = local_118[0xd] - local_118[5] * I[2][2];
        local_118[0xe] = local_118[0xe] - local_118[6] * I[2][2];
        local_118[0xf] = local_118[0xf] - I[2][2] * local_118[7];
      }
      pdVar11 = I[1] + 3;
      dVar24 = ABS(I[1][3]);
      iVar18 = 2;
      uVar19 = 2;
      uVar14 = 2;
      do {
        lVar13 = 0;
        dVar22 = dVar24;
        do {
          dVar24 = ABS(pdVar11[lVar13]);
          if (dVar22 < dVar24) {
            uVar14 = uVar19 & 0xffffffff;
          }
          iVar9 = (int)lVar13 + 2;
          if (dVar24 <= dVar22) {
            dVar24 = dVar22;
            iVar9 = iVar18;
          }
          iVar18 = iVar9;
          lVar13 = lVar13 + 1;
          dVar22 = dVar24;
        } while (lVar13 != 2);
        uVar19 = uVar19 + 1;
        pdVar11 = pdVar11 + 4;
      } while (uVar19 != 4);
      if (dVar24 < *pivot) {
        *pivot = dVar24;
      }
      if ((int)uVar14 != 2) {
        I[1][1] = I[2][1];
        I[1][2] = I[2][2];
        I[2][1] = dVar23;
        I[2][2] = dVar21;
        I[1][3] = I[2][3];
        I[2][0] = I[3][0];
        I[2][3] = dVar7;
        I[3][0] = dVar8;
        local_118[8] = local_118[0xc];
        local_118[9] = local_118[0xd];
        local_118[0xc] = dVar3;
        local_118[0xd] = dVar4;
        local_118[10] = local_118[0xe];
        local_118[0xb] = local_118[0xf];
        local_118[0xe] = dVar5;
        local_118[0xf] = dVar6;
        bVar20 = (bool)(bVar20 ^ 1);
      }
      dVar21 = I[2][3];
      dVar23 = I[1][3];
      iVar9 = 2;
      if (iVar18 == 2) {
        iVar18 = 2;
      }
      else {
        local_118[0x12] = I[0][0];
        I[0][0] = dVar2;
        I[0][3] = I[1][0];
        I[1][0] = dVar1;
        I[1][3] = I[2][0];
        I[2][0] = dVar23;
        I[2][3] = I[3][0];
        I[3][0] = dVar21;
        bVar20 = (bool)(bVar20 ^ 1);
        iVar18 = 3;
      }
      if (0.0 < dVar24) {
        I[2][0] = I[2][0] / I[1][3];
        local_118[8] = local_118[8] / I[1][3];
        local_118[9] = local_118[9] / I[1][3];
        local_118[10] = local_118[10] / I[1][3];
        local_118[0xb] = local_118[0xb] / I[1][3];
        dVar24 = dVar24 * 2.220446049250313e-16;
        if (dVar24 < ABS(local_118[0x12])) {
          I[0][0] = I[0][0] - local_118[0x12] * I[2][0];
          local_118[0] = local_118[0] - local_118[0x12] * local_118[8];
          local_118[1] = local_118[1] - local_118[9] * local_118[0x12];
          local_118[2] = local_118[2] - local_118[10] * local_118[0x12];
          local_118[3] = local_118[3] - local_118[0x12] * local_118[0xb];
        }
        if (dVar24 < ABS(I[0][3])) {
          I[1][0] = I[1][0] - I[0][3] * I[2][0];
          local_118[4] = local_118[4] - I[0][3] * local_118[8];
          local_118[5] = local_118[5] - local_118[9] * I[0][3];
          local_118[6] = local_118[6] - local_118[10] * I[0][3];
          local_118[7] = local_118[7] - I[0][3] * local_118[0xb];
        }
        if (dVar24 < ABS(I[2][3])) {
          I[3][0] = I[3][0] - I[2][3] * I[2][0];
          local_118[0xc] = local_118[0xc] - I[2][3] * local_118[8];
          local_118[0xd] = local_118[0xd] - local_118[9] * I[2][3];
          local_118[0xe] = local_118[0xe] - local_118[10] * I[2][3];
          local_118[0xf] = local_118[0xf] - I[2][3] * local_118[0xb];
        }
        dVar23 = ABS(I[3][0]);
        if (dVar23 < *pivot) {
          *pivot = dVar23;
        }
        if (I[3][0] == 0.0) {
          iVar9 = 3;
        }
        else {
          local_118[0xc] = local_118[0xc] / I[3][0];
          local_118[0xd] = local_118[0xd] / I[3][0];
          local_118[0xe] = local_118[0xe] / I[3][0];
          local_118[0xf] = local_118[0xf] / I[3][0];
          dVar23 = dVar23 * 2.220446049250313e-16;
          if (dVar23 < ABS(I[0][0])) {
            local_118[0] = local_118[0] - I[0][0] * local_118[0xc];
            local_118[1] = local_118[1] - local_118[0xd] * I[0][0];
            local_118[2] = local_118[2] - local_118[0xe] * I[0][0];
            local_118[3] = local_118[3] - I[0][0] * local_118[0xf];
          }
          if (dVar23 < ABS(I[1][0])) {
            local_118[4] = local_118[4] - I[1][0] * local_118[0xc];
            local_118[5] = local_118[5] - local_118[0xd] * I[1][0];
            local_118[6] = local_118[6] - local_118[0xe] * I[1][0];
            local_118[7] = local_118[7] - I[1][0] * local_118[0xf];
          }
          if (dVar23 < ABS(I[2][0])) {
            local_118[8] = local_118[8] - local_118[0xc] * I[2][0];
            local_118[9] = local_118[9] - local_118[0xd] * I[2][0];
            local_118[10] = local_118[10] - local_118[0xe] * I[2][0];
            local_118[0xb] = local_118[0xb] - I[2][0] * local_118[0xf];
          }
          dVar23 = (((1.0 / local_118[0x10]) / I[0][2]) / I[1][3]) / I[3][0];
          if (bVar20) {
            dVar23 = -dVar23;
          }
          *determinant = dVar23;
          iVar9 = 4;
        }
      }
    }
  }
  dVar2 = local_118[0xb];
  dVar1 = local_118[10];
  dVar24 = local_118[9];
  dVar21 = local_118[8];
  dVar23 = local_118[4];
  if (iVar18 != 2) {
    local_118[8] = local_118[0xc];
    local_118[9] = local_118[0xd];
    local_118[0xc] = dVar21;
    local_118[0xd] = dVar24;
    local_118[10] = local_118[0xe];
    local_118[0xb] = local_118[0xf];
    local_118[0xe] = dVar1;
    local_118[0xf] = dVar2;
  }
  if (iVar16 != 1) {
    lVar13 = (long)iVar16;
    local_118[4] = local_118[lVar13 * 4];
    local_118[lVar13 * 4] = dVar23;
    dVar23 = local_118[5];
    local_118[5] = I[lVar13 + -5][2];
    I[lVar13 + -5][2] = dVar23;
    dVar23 = local_118[6];
    local_118[6] = I[lVar13 + -5][3];
    I[lVar13 + -5][3] = dVar23;
    dVar23 = local_118[7];
    local_118[7] = I[lVar13 + -4][0];
    I[lVar13 + -4][0] = dVar23;
  }
  dVar23 = local_118[0];
  if (iVar12 != 0) {
    lVar13 = (long)iVar12;
    local_118[0] = local_118[lVar13 * 4];
    local_118[lVar13 * 4] = dVar23;
    dVar23 = local_118[1];
    local_118[1] = I[lVar13 + -5][2];
    I[lVar13 + -5][2] = dVar23;
    dVar23 = local_118[2];
    local_118[2] = I[lVar13 + -5][3];
    I[lVar13 + -5][3] = dVar23;
    dVar23 = local_118[3];
    local_118[3] = I[lVar13 + -4][0];
    I[lVar13 + -4][0] = dVar23;
  }
  pdVar11 = local_118;
  for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
    (*dst)[0] = *pdVar11;
    pdVar11 = pdVar11 + 1;
    dst = (double (*) [4])((long)dst + 8);
  }
  return iVar9;
}

Assistant:

static int Inv( const double* src, double dst[4][4], double* determinant, double* pivot )
{
  // returns rank (0, 1, 2, 3, or 4), inverse, and smallest pivot

	double M[4][4], I[4][4], x, c, d;
	int i, j, ix, jx;
  int col[4] = {0,1,2,3};
  int swapcount = 0;
  int rank = 0;

  *pivot = 0.0;
  *determinant = 0.0;

  memset( I, 0, sizeof(I) );
  I[0][0] = I[1][1] = I[2][2] = I[3][3] = 1.0;

  memcpy( M, src, sizeof(M) );

  // some loops unrolled for speed

  ix = jx = 0;
	x = fabs(M[0][0]);
  for ( i = 0; i < 4; i++ ) for ( j = 0; j < 4; j++ ) {
    if ( fabs(M[i][j]) > x ) {
      ix = i;
      jx = j;
      x = fabs(M[i][j]);
    }
  }
  *pivot = x;
  if ( ix != 0 ) {
    SwapRow( M, 0, ix );
    SwapRow( I, 0, ix );
    swapcount++;
  }
  if ( jx != 0 ) {
    SwapCol( M, 0, jx );
    col[0] = jx;
    swapcount++;
  }

  if ( x > 0.0 ) {
    rank++;

    // 17 August 2011 Dale Lear
    //   The result is slightly more accurate when using division
    //   instead of multiplying by the inverse of M[0][0]. If there
    //   is any speed penalty at this point in history, the accuracy
    //   is more important than the additional clocks.
    //c = d = 1.0/M[0][0];
    //M[0][1] *= c; M[0][2] *= c; M[0][3] *= c;
    //ScaleRow( I, c, 0 );
    c = M[0][0];
    M[0][1] /= c; M[0][2] /= c; M[0][3] /= c;
    I[0][0] /= c; I[0][1] /= c; I[0][2] /= c; I[0][3] /= c;
    d = 1.0/c;

    x *=  ON_EPSILON;

	  if (fabs(M[1][0]) > x) {
		  c = -M[1][0];
      M[1][1] += c*M[0][1]; M[1][2] += c*M[0][2]; M[1][3] += c*M[0][3];
      AddCxRow( I, c, 0, 1 );
	  }
	  if (fabs(M[2][0]) >  x) {
		  c = -M[2][0];
      M[2][1] += c*M[0][1]; M[2][2] += c*M[0][2]; M[2][3] += c*M[0][3];
      AddCxRow( I, c, 0, 2 );
	  }
	  if (fabs(M[3][0]) >  x) {
		  c = -M[3][0];
      M[3][1] += c*M[0][1]; M[3][2] += c*M[0][2]; M[3][3] += c*M[0][3];
      AddCxRow( I, c, 0, 3 );
	  }

    ix = jx = 1;
	  x = fabs(M[1][1]);
    for ( i = 1; i < 4; i++ ) for ( j = 1; j < 4; j++ ) {
      if ( fabs(M[i][j]) > x ) {
        ix = i;
        jx = j;
        x = fabs(M[i][j]);
      }
    }
    if ( x < *pivot )
      *pivot = x;
    if ( ix != 1 ) {
      SwapRow( M, 1, ix );
      SwapRow( I, 1, ix );
      swapcount++;
    }
    if ( jx != 1 ) {
      SwapCol( M, 1, jx );
      col[1] = jx;
      swapcount++;
    }
    if ( x > 0.0 ) {
      rank++;

      // 17 August 2011 Dale Lear
      //   The result is slightly more accurate when using division
      //   instead of multiplying by the inverse of M[1][1]. If there
      //   is any speed penalty at this point in history, the accuracy
      //   is more important than the additional clocks.
      //c = 1.0/M[1][1];
      //d *= c;
      //M[1][2] *= c; M[1][3] *= c;
      //ScaleRow( I, c, 1 );
      c = M[1][1];
      M[1][2] /= c; M[1][3] /= c;
      I[1][0] /= c; I[1][1] /= c; I[1][2] /= c; I[1][3] /= c;
      d /= c;

      x *= ON_EPSILON;
      if (fabs(M[0][1]) >  x) {
        c = -M[0][1];
        M[0][2] += c*M[1][2]; M[0][3] += c*M[1][3];
        AddCxRow( I, c, 1, 0 );
      }
      if (fabs(M[2][1]) >  x) {
        c = -M[2][1];
        M[2][2] += c*M[1][2]; M[2][3] += c*M[1][3];
        AddCxRow( I, c, 1, 2 );
      }
      if (fabs(M[3][1]) >  x) {
        c = -M[3][1];
        M[3][2] += c*M[1][2]; M[3][3] += c*M[1][3];
        AddCxRow( I, c, 1, 3 );
      }

      ix = jx = 2;
	    x = fabs(M[2][2]);
      for ( i = 2; i < 4; i++ ) for ( j = 2; j < 4; j++ ) {
        if ( fabs(M[i][j]) > x ) {
          ix = i;
          jx = j;
          x = fabs(M[i][j]);
        }
      }
      if ( x < *pivot )
        *pivot = x;
      if ( ix != 2 ) {
        SwapRow( M, 2, ix );
        SwapRow( I, 2, ix );
        swapcount++;
      }
      if ( jx != 2 ) {
        SwapCol( M, 2, jx );
        col[2] = jx;
        swapcount++;
      }
      if ( x > 0.0 ) {
        rank++;

        // 17 August 2011 Dale Lear
        //   The result is slightly more accurate when using division
        //   instead of multiplying by the inverse of M[2][2]. If there
        //   is any speed penalty at this point in history, the accuracy
        //   is more important than the additional clocks.
        //c = 1.0/M[2][2];
        //d *= c;
        //M[2][3] *= c;
        //ScaleRow( I, c, 2 );
        c = M[2][2];
        M[2][3] /= c;
        I[2][0] /= c; I[2][1] /= c; I[2][2] /= c; I[2][3] /= c;
        d /= c;

        x *= ON_EPSILON;
        if (fabs(M[0][2]) >  x) {
          c = -M[0][2];
          M[0][3] += c*M[2][3];
          AddCxRow( I, c, 2, 0 );
        }
        if (fabs(M[1][2]) >  x) {
          c = -M[1][2];
          M[1][3] += c*M[2][3];
          AddCxRow( I, c, 2, 1 );
        }
        if (fabs(M[3][2]) >  x) {
          c = -M[3][2];
          M[3][3] += c*M[2][3];
          AddCxRow( I, c, 2, 3 );
        }

        x = fabs(M[3][3]);
        if ( x < *pivot )
          *pivot = x;

        if ( x > 0.0 ) {
          rank++;

          // 17 August 2011 Dale Lear
          //   The result is slightly more accurate when using division
          //   instead of multiplying by the inverse of M[3][3]. If there
          //   is any speed penalty at this point in history, the accuracy
          //   is more important than the additional clocks.
          //c = 1.0/M[3][3];
          //d *= c;
          //ScaleRow( I, c, 3 );
          c = M[3][3];
          I[3][0] /= c; I[3][1] /= c; I[3][2] /= c; I[3][3] /= c;
          d /= c;

          x *= ON_EPSILON;
          if (fabs(M[0][3]) >  x) {
            AddCxRow( I, -M[0][3], 3, 0 );
          }
          if (fabs(M[1][3]) >  x) {
            AddCxRow( I, -M[1][3], 3, 1 );
          }
          if (fabs(M[2][3]) >  x) {
            AddCxRow( I, -M[2][3], 3, 2 );
          }

          *determinant = (swapcount%2) ? -d : d;
        }
      }
    }
  }

  if ( col[3] != 3 )
    SwapRow( I, 3, col[3] );
  if ( col[2] != 2 )
    SwapRow( I, 2, col[2] );
  if ( col[1] != 1 )
    SwapRow( I, 1, col[1] );
  if ( col[0] != 0 )
    SwapRow( I, 0, col[0] );

  memcpy( dst, I, sizeof(I) );
	return rank;
}